

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateBaseClass.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::DynamicStateBaseClass::beginRenderPassWithClearColor
          (DynamicStateBaseClass *this,VkClearColorValue *clearColor)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer cmdBuffer;
  VkCommandBuffer_s *pVVar2;
  VkRect2D _renderArea;
  VkCommandBuffer_s **ppVVar3;
  Image *pIVar4;
  VkImage VVar5;
  Handle<(vk::HandleType)17> *pHVar6;
  Handle<(vk::HandleType)23> *pHVar7;
  Move<vk::VkCommandBuffer_s_*> *this_00;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> local_128;
  VkOffset2D local_108;
  VkExtent2D VStack_100;
  VkFramebuffer local_f0;
  VkRenderPass local_e8;
  undefined1 local_e0 [8];
  RenderPassBeginInfo renderPassBegin;
  VkRect2D renderArea;
  VkMemoryBarrier memBarrier;
  undefined1 local_54 [8];
  ImageSubresourceRange subresourceRange;
  undefined1 local_38 [8];
  CmdBufferBeginInfo beginInfo;
  VkClearColorValue *clearColor_local;
  DynamicStateBaseClass *this_local;
  
  beginInfo.super_VkCommandBufferBeginInfo.pInheritanceInfo =
       (VkCommandBufferInheritanceInfo *)clearColor;
  Draw::CmdBufferBeginInfo::CmdBufferBeginInfo((CmdBufferBeginInfo *)local_38,0);
  pDVar1 = this->m_vk;
  this_00 = &this->m_cmdBuffer;
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x49])(pDVar1,*ppVVar3,(CmdBufferBeginInfo *)local_38);
  pDVar1 = this->m_vk;
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  cmdBuffer = *ppVVar3;
  pIVar4 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_colorTargetImage);
  subresourceRange.super_VkImageSubresourceRange._12_8_ = Draw::Image::object(pIVar4);
  Draw::initialTransitionColor2DImage
            (pDVar1,cmdBuffer,(VkImage)subresourceRange.super_VkImageSubresourceRange._12_8_,
             VK_IMAGE_LAYOUT_GENERAL);
  Draw::ImageSubresourceRange::ImageSubresourceRange((ImageSubresourceRange *)local_54,1,0,1,0,1);
  pDVar1 = this->m_vk;
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar3;
  pIVar4 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_colorTargetImage);
  VVar5 = Draw::Image::object(pIVar4);
  (*pDVar1->_vptr_DeviceInterface[0x66])
            (pDVar1,pVVar2,VVar5.m_internal,1,
             beginInfo.super_VkCommandBufferBeginInfo.pInheritanceInfo,1,
             (ImageSubresourceRange *)local_54);
  renderArea.extent.width = 0x2e;
  renderArea.extent.height = 0;
  pDVar1 = this->m_vk;
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,*ppVVar3,0x1000,0x400,0,1,&renderArea.extent,0,0,0,0);
  renderPassBegin.m_clearValues.
  super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  renderArea.offset.x = 0x80;
  renderArea.offset.y = 0x80;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_e8.m_internal = pHVar6->m_internal;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                     (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  local_f0.m_internal = pHVar7->m_internal;
  local_108 = (VkOffset2D)
              renderPassBegin.m_clearValues.
              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  VStack_100.width = renderArea.offset.x;
  VStack_100.height = renderArea.offset.y;
  local_128.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector(&local_128);
  _renderArea.extent = VStack_100;
  _renderArea.offset = local_108;
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            ((RenderPassBeginInfo *)local_e0,local_e8,local_f0,_renderArea,&local_128);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~vector(&local_128);
  pDVar1 = this->m_vk;
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x74])(pDVar1,*ppVVar3,local_e0,0);
  Draw::RenderPassBeginInfo::~RenderPassBeginInfo((RenderPassBeginInfo *)local_e0);
  return;
}

Assistant:

void DynamicStateBaseClass::beginRenderPassWithClearColor (const vk::VkClearColorValue& clearColor)
{
	const CmdBufferBeginInfo beginInfo;
	m_vk.beginCommandBuffer(*m_cmdBuffer, &beginInfo);

	initialTransitionColor2DImage(m_vk, *m_cmdBuffer, m_colorTargetImage->object(), vk::VK_IMAGE_LAYOUT_GENERAL);

	const ImageSubresourceRange subresourceRange(vk::VK_IMAGE_ASPECT_COLOR_BIT);
	m_vk.cmdClearColorImage(*m_cmdBuffer, m_colorTargetImage->object(),
		vk::VK_IMAGE_LAYOUT_GENERAL, &clearColor, 1, &subresourceRange);

	const vk::VkMemoryBarrier memBarrier =
	{
		vk::VK_STRUCTURE_TYPE_MEMORY_BARRIER,
		DE_NULL,
		vk::VK_ACCESS_TRANSFER_WRITE_BIT,
		vk::VK_ACCESS_COLOR_ATTACHMENT_READ_BIT | vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT
	};

	m_vk.cmdPipelineBarrier(*m_cmdBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT,
		vk::VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT,
		0, 1, &memBarrier, 0, DE_NULL, 0, DE_NULL);

	const vk::VkRect2D renderArea = { { 0, 0 }, { WIDTH, HEIGHT } };
	const RenderPassBeginInfo renderPassBegin(*m_renderPass, *m_framebuffer, renderArea);

	m_vk.cmdBeginRenderPass(*m_cmdBuffer, &renderPassBegin, vk::VK_SUBPASS_CONTENTS_INLINE);
}